

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi_info_from_memory(stbi_uc *buffer,int len,int *x,int *y,int *comp)

{
  int iVar1;
  int in_ESI;
  stbi_uc *in_RDI;
  stbi__context s;
  int *in_stack_fffffffffffffef8;
  int *in_stack_ffffffffffffff00;
  stbi__context *in_stack_ffffffffffffff08;
  
  stbi__start_mem((stbi__context *)&stack0xfffffffffffffef8,in_RDI,in_ESI);
  iVar1 = stbi__info_main(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                          in_stack_fffffffffffffef8,(int *)0x18cef5);
  return iVar1;
}

Assistant:

STBIDEF int stbi_info_from_memory(stbi_uc const *buffer, int len, int *x, int *y, int *comp)
{
   stbi__context s;
   stbi__start_mem(&s,buffer,len);
   return stbi__info_main(&s,x,y,comp);
}